

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O3

uint32_t __thiscall asmjit::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  BaseCompiler **ppBVar1;
  uint32_t *puVar2;
  char *pcVar3;
  uint32_t uVar4;
  uint *puVar5;
  FuncNode *pFVar6;
  BaseNode *pBVar7;
  void *pvVar8;
  uint8_t uVar9;
  Error EVar10;
  RABlock *pRVar11;
  RABlock *pRVar12;
  Logger *pLVar13;
  undefined8 extraout_RAX;
  byte bVar14;
  byte bVar15;
  uint in_ECX;
  uint extraout_EDX;
  uint uVar16;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint uVar17;
  InvokeNode *initialNode;
  ulong uVar19;
  RACFGBuilder *this_00;
  RATiedReg *pRVar20;
  BaseRAPass *pBVar21;
  int in_R8D;
  uint in_R9D;
  uint uVar22;
  long lVar23;
  RABlock **item;
  InvokeNode *invokeNode;
  uint64_t uVar24;
  float __x;
  int unaff_retaddr;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint32_t uStack_cdc;
  RABlock **ppRStack_cd8;
  LabelNode *pLStack_cd0;
  ZoneVector<asmjit::RABlock_*> ZStack_cc8;
  long lStack_cb8;
  RABlock *pRStack_cb0;
  RAInstBuilder RStack_ca8;
  ulong uStack_70;
  ulong uVar18;
  
  this_00 = (RACFGBuilder *)&(this->_baseInst)._extraReg._id;
  if (id < this_00) {
    getRewriteIndex();
  }
  else {
    id = (uint32_t *)((long)id - (long)this_00 >> 2);
    if (id < (uint *)0x20) {
      return (uint32_t)id;
    }
  }
  getRewriteIndex();
  uVar22 = id[8] >> 8 & 0xf;
  uVar19 = (ulong)uVar22;
  uVar18 = *(ulong *)(id + 4);
  bVar15 = (byte)in_R8D;
  uVar16 = extraout_EDX;
  if (in_R8D == 0xff) {
LAB_00133183:
    bVar14 = (byte)unaff_retaddr;
    if (unaff_retaddr != 0xff) {
      if (3 < uVar22) goto LAB_001332a6;
      pcVar3 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
               uVar19 * 4 + -0x60;
      *(uint *)pcVar3 = *(uint *)pcVar3 | 1 << (bVar14 & 0x1f);
      uVar16 = uVar16 | 0x2000;
    }
    *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | uVar16;
    puVar5 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar5 = *puVar5 | 1 << (sbyte)uVar22;
    if (uVar18 != 0) {
      if (in_R8D != 0xff) {
        if (*(char *)(uVar18 + 0x15) != -1) {
          return 0x41;
        }
        *(byte *)(uVar18 + 0x15) = bVar15;
      }
      if (unaff_retaddr != 0xff) {
        if (*(char *)(uVar18 + 0x16) != -1) {
          return 0x41;
        }
        *(byte *)(uVar18 + 0x16) = bVar14;
      }
      *(char *)(uVar18 + 0x14) = *(char *)(uVar18 + 0x14) + '\x01';
      *(uint *)(uVar18 + 4) = *(uint *)(uVar18 + 4) | uVar16;
      *(uint *)(uVar18 + 8) = *(uint *)(uVar18 + 8) & in_ECX;
      *(uint *)(uVar18 + 0xc) = *(uint *)(uVar18 + 0xc) | in_R9D;
      *(uint *)(uVar18 + 0x10) = *(uint *)(uVar18 + 0x10) | in_stack_00000008;
      bVar15 = (byte)in_stack_00000010;
      if (in_stack_00000010 < *(byte *)(uVar18 + 0x17)) {
        bVar15 = *(byte *)(uVar18 + 0x17);
      }
      *(byte *)(uVar18 + 0x17) = bVar15;
      return 0;
    }
    puVar5 = (uint *)(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    uVar17 = (int)((ulong)((long)puVar5 + (-0x38 - (long)this_00)) >> 3) * -0x55555555;
    uVar18 = (ulong)uVar17;
    if ((uVar17 & 0xffffff80) != 0) goto LAB_001332ab;
    (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
    super_ZoneVectorBase._data = puVar5 + 6;
    uVar18 = (ulong)*id;
    *puVar5 = *id;
    puVar5[1] = uVar16;
    puVar5[2] = in_ECX;
    puVar5[3] = in_R9D;
    puVar5[4] = in_stack_00000008;
    *(undefined1 *)(puVar5 + 5) = 1;
    *(byte *)((long)puVar5 + 0x15) = bVar15;
    *(byte *)((long)puVar5 + 0x16) = bVar14;
    *(byte *)((long)puVar5 + 0x17) = (byte)in_stack_00000010;
    *(uint **)(id + 4) = puVar5;
    if (3 < uVar22) goto LAB_001332b0;
    if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData[uVar19 - 0x78]
        != -1) {
      ppBVar1 = &(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
      *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar22 << 3) & 0x1f));
      return 0;
    }
  }
  else {
    puVar5 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar5 = *puVar5 | 0x100 << (sbyte)uVar22;
    if (uVar22 < 4) {
      pcVar3 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
               uVar19 * 4 + -0x70;
      *(uint *)pcVar3 = *(uint *)pcVar3 | 1 << (bVar15 & 0x1f);
      uVar16 = extraout_EDX | 0x1000;
      goto LAB_00133183;
    }
    RAInstBuilder::add();
LAB_001332a6:
    RAInstBuilder::add();
LAB_001332ab:
    RAInstBuilder::add();
LAB_001332b0:
    RAInstBuilder::add();
  }
  RAInstBuilder::add();
  if (extraout_EDX_00 == 0xff) {
    RAInstBuilder::addCallArg();
LAB_0013339f:
    RAInstBuilder::addCallArg();
LAB_001333a4:
    RAInstBuilder::addCallArg();
  }
  else {
    uVar16 = id[8] >> 8 & 0xf;
    bVar15 = (byte)extraout_EDX_00;
    uVar22 = 1 << (bVar15 & 0x1f);
    *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | 0x1101;
    if (3 < uVar16) goto LAB_0013339f;
    pcVar3 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
             (ulong)uVar16 * 4 + -0x70;
    *(uint *)pcVar3 = *(uint *)pcVar3 | uVar22;
    puVar5 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar5 = *puVar5 | 0x101 << (sbyte)uVar16;
    lVar23 = *(long *)(id + 4);
    if (lVar23 != 0) {
      if (*(char *)(lVar23 + 0x15) == -1) {
        *(byte *)(lVar23 + 0x15) = bVar15;
        *(uint *)(lVar23 + 8) = *(uint *)(lVar23 + 8) & uVar22;
        uVar16 = 0x1101;
      }
      else {
        *(uint *)(lVar23 + 8) = *(uint *)(lVar23 + 8) | uVar22;
        uVar16 = 0x11101;
      }
      *(char *)(lVar23 + 0x14) = *(char *)(lVar23 + 0x14) + '\x01';
      *(uint *)(lVar23 + 4) = *(uint *)(lVar23 + 4) | uVar16;
      return 0;
    }
    puVar5 = (uint *)(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    if (((int)((ulong)((long)puVar5 + (-0x38 - (long)this_00)) >> 3) * -0x55555555 & 0xffffff80U) !=
        0) goto LAB_001333a4;
    (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
    super_ZoneVectorBase._data = puVar5 + 6;
    *puVar5 = *id;
    puVar5[1] = 0x1101;
    puVar5[2] = uVar22;
    puVar5[3] = 0;
    puVar5[4] = 0;
    *(undefined1 *)(puVar5 + 5) = 1;
    *(byte *)((long)puVar5 + 0x15) = bVar15;
    *(undefined2 *)((long)puVar5 + 0x16) = 0xff;
    *(uint **)(id + 4) = puVar5;
    if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData
        [(ulong)uVar16 - 0x78] != -1) {
      ppBVar1 = &(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
      *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar16 << 3) & 0x1f));
      return 0;
    }
  }
  RAInstBuilder::addCallArg();
  if (extraout_EDX_01 == 0xff) {
    RAInstBuilder::addCallRet();
LAB_00133488:
    RAInstBuilder::addCallRet();
  }
  else {
    uVar16 = id[8] >> 8 & 0xf;
    bVar15 = (byte)extraout_EDX_01;
    uVar22 = 1 << (bVar15 & 0x1f);
    *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass =
         *(uint *)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass | 0x2202;
    if (3 < uVar16) goto LAB_00133488;
    pcVar3 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData +
             (ulong)uVar16 * 4 + -0x70;
    *(uint *)pcVar3 = *(uint *)pcVar3 | uVar22;
    puVar5 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc + 4);
    *puVar5 = *puVar5 | 0x101 << (sbyte)uVar16;
    lVar23 = *(long *)(id + 4);
    if (lVar23 != 0) {
      if (*(char *)(lVar23 + 0x16) == -1) {
        *(char *)(lVar23 + 0x14) = *(char *)(lVar23 + 0x14) + '\x01';
        *(uint *)(lVar23 + 4) = *(uint *)(lVar23 + 4) | 0x2202;
        *(byte *)(lVar23 + 0x16) = bVar15;
        return 0;
      }
      return 0x41;
    }
    puVar5 = (uint *)(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap
                     .super_ZoneVectorBase._data;
    if (((int)((ulong)((long)puVar5 + (-0x38 - (long)this_00)) >> 3) * -0x55555555 & 0xffffff80U) ==
        0) {
      (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sharedAssignmentsMap.
      super_ZoneVectorBase._data = puVar5 + 6;
      *puVar5 = *id;
      puVar5[1] = 0x2202;
      puVar5[2] = uVar22;
      puVar5[3] = 0;
      puVar5[4] = 0;
      *(undefined2 *)(puVar5 + 5) = 0xff01;
      *(byte *)((long)puVar5 + 0x16) = bVar15;
      *(undefined1 *)((long)puVar5 + 0x17) = 0;
      *(uint **)(id + 4) = puVar5;
      if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._sb._embeddedData
          [(ulong)uVar16 - 0x78] != -1) {
        ppBVar1 = &(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
        *(int *)ppBVar1 = *(int *)ppBVar1 + (1 << ((byte)(uVar16 << 3) & 0x1f));
        return 0;
      }
      goto LAB_00133492;
    }
  }
  RAInstBuilder::addCallRet();
LAB_00133492:
  RAInstBuilder::addCallRet();
  pLVar13 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger;
  uStack_70 = uVar18;
  if (pLVar13 != (Logger *)0x0) {
    Logger::logf(pLVar13,__x);
  }
  EVar10 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::prepare
                     (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>);
  if (EVar10 == 0) {
    if (((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) &&
       (RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                  (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                   (BaseNode *)(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode,2
                   ,(char *)0x0),
       (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0)) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                 (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock,2);
    }
    item = &(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
    pFVar6 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode;
    invokeNode = (InvokeNode *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar6->super_LabelNode)->_links[1];
    if (invokeNode != (InvokeNode *)0x0) {
      pRStack_cb0 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
      pRStack_cb0->_first = (BaseNode *)pFVar6;
      pRStack_cb0->_last = (BaseNode *)pFVar6;
      RStack_ca8._cur = RStack_ca8._tiedRegs;
      RStack_ca8._clobbered._masks[0] = 0;
      RStack_ca8._clobbered._masks[1] = 0;
      RStack_ca8._clobbered._masks[2] = 0;
      RStack_ca8._clobbered._masks[3] = 0;
      RStack_ca8._used._masks[0] = 0;
      RStack_ca8._used._masks[1] = 0;
      RStack_ca8._used._masks[2] = 0;
      RStack_ca8._used._masks[3] = 0;
      RStack_ca8._aggregatedFlags = 0;
      RStack_ca8._forbiddenFlags = 0;
      RStack_ca8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      RStack_ca8._stats._packed = 0;
      ZStack_cc8.super_ZoneVectorBase._data = (void *)0x0;
      ZStack_cc8.super_ZoneVectorBase._size = 0;
      ZStack_cc8.super_ZoneVectorBase._capacity = 0;
      ppRStack_cd8 = item;
LAB_00133567:
      do {
        pRVar20 = RStack_ca8._tiedRegs;
        uVar4 = (invokeNode->super_InstNode).super_BaseNode._position;
        if (1 < uVar4 + 1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
        if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) == 0) {
          uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar9 == '\x03') {
            pRVar11 = *item;
            pRVar12 = (RABlock *)(invokeNode->super_InstNode).super_BaseNode._passData;
            if (pRVar11 == (RABlock *)0x0) {
              *item = pRVar12;
              if (pRVar12 == (RABlock *)0x0) {
                pRVar12 = BaseRAPass::newBlock
                                    ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                     ,(BaseNode *)invokeNode);
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar12;
                if (pRVar12 == (RABlock *)0x0) {
                  return 1;
                }
                (invokeNode->super_InstNode).super_BaseNode._passData = pRVar12;
                uVar16 = pRVar12->_flags;
              }
              else {
                uVar16 = pRVar12->_flags;
                if ((uVar16 & 1) != 0) goto LAB_00133c6f;
              }
              pRVar12->_flags = uVar16 | 4;
              (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
              (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0;
              EVar10 = BaseRAPass::addBlock
                                 ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                  pRVar12);
              if (EVar10 != 0) {
                return EVar10;
              }
              pRVar12 = *ppRStack_cd8;
            }
            else if (pRVar12 == (RABlock *)0x0) {
              if ((pRVar11 == pRStack_cb0 |
                  (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode) == 1) {
                if ((InvokeNode *)pRVar11->_last == invokeNode) goto LAB_00133d03;
                pRVar11->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar11->_flags = pRVar11->_flags | 0x201;
                (pRVar11->_regsStats)._packed =
                     (pRVar11->_regsStats)._packed |
                     (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                     _packed;
                pRVar11 = BaseRAPass::newBlock
                                    ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                     ,(BaseNode *)invokeNode);
                if (pRVar11 == (RABlock *)0x0) {
                  return 1;
                }
                *(byte *)&pRVar11->_flags = (byte)pRVar11->_flags | 4;
                EVar10 = RABlock::appendSuccessor(*ppRStack_cd8,pRVar11);
                if (EVar10 != 0) {
                  return EVar10;
                }
                EVar10 = BaseRAPass::addBlock
                                   ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                    pRVar11);
                if (EVar10 != 0) {
                  return EVar10;
                }
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar11;
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0
                ;
              }
              (invokeNode->super_InstNode).super_BaseNode._passData = pRVar11;
              pRVar12 = pRVar11;
            }
            else {
              *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
              if (pRVar11 == pRVar12) {
                pRVar12 = pRVar11;
                if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode != false)
                break;
              }
              else {
                if ((InvokeNode *)pRVar11->_last == invokeNode) {
LAB_00133cfe:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
LAB_00133d03:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar11->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar11->_flags = pRVar11->_flags | 0x201;
                (pRVar11->_regsStats)._packed =
                     (pRVar11->_regsStats)._packed |
                     (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats.
                     _packed;
                EVar10 = RABlock::appendSuccessor(pRVar11,pRVar12);
                if (EVar10 != 0) {
                  return EVar10;
                }
                EVar10 = BaseRAPass::addBlock
                                   ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                    pRVar12);
                if (EVar10 != 0) {
                  return EVar10;
                }
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar12;
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0
                ;
              }
            }
            item = ppRStack_cd8;
            pLVar13 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger;
            if ((pRVar12 == (RABlock *)0x0) ||
               (pRVar12 ==
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._lastLoggedBlock)) {
LAB_00133b34:
              if (pLVar13 != (Logger *)0x0) {
                RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                          (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                           (BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar13 != (Logger *)0x0) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,pRVar12,2);
              pLVar13 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger;
              goto LAB_00133b34;
            }
            if ((invokeNode->super_InstNode)._baseInst._id ==
                (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._exitLabelId) {
              pRVar11 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
              pRVar11->_last = (BaseNode *)invokeNode;
              *(byte *)&pRVar11->_flags = (byte)pRVar11->_flags | 1;
              (pRVar11->_regsStats)._packed =
                   (pRVar11->_regsStats)._packed |
                   (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed;
              EVar10 = BaseRAPass::addExitBlock
                                 ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                  pRVar11);
LAB_0013390f:
              if (EVar10 != 0) {
                return EVar10;
              }
              goto LAB_00133b95;
            }
          }
          else {
            if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0)
            {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                        (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                         (BaseNode *)invokeNode,4,(char *)0x0);
              uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
            }
            if (uVar9 == '\n') {
              if (invokeNode ==
                  (InvokeNode *)
                  ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode)->_end) {
                if (*item == (RABlock *)0x0) goto LAB_00133c6f;
                break;
              }
            }
            else if ((uVar9 == '\x10') &&
                    (invokeNode !=
                     (InvokeNode *)
                     (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._funcNode)) break;
          }
        }
        else {
          if (*item == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::removeNode
                      (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                       (BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00133567;
          }
          (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = true;
          uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar9 - 0x11) < 2) {
            if (uVar4 == 0xffffffff) {
              (invokeNode->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar7 = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar9 == '\x12') {
                EVar10 = x86::RACFGBuilder::onBeforeInvoke(this_00,invokeNode);
              }
              else {
                EVar10 = x86::RACFGBuilder::onBeforeRet(this_00,(FuncRetNode *)invokeNode);
              }
              if (EVar10 != 0) {
                return EVar10;
              }
              if (pBVar7 != (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                if ((InvokeNode *)(*item)->_first == invokeNode) {
                  (*item)->_first = (pBVar7->field_0).field_0._next;
                }
                (invokeNode->super_InstNode).super_BaseNode._position = 0xffffffff;
                invokeNode = (InvokeNode *)(pBVar7->field_0)._links[1];
                if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) ==
                    0) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_00133cfe;
                }
              }
              initialNode = (InvokeNode *)
                            (invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
            }
          }
          if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                       (BaseNode *)invokeNode,4,(char *)0x0);
          }
          uStack_cdc = 0;
          RStack_ca8._aggregatedFlags = 0;
          RStack_ca8._forbiddenFlags = 0;
          RStack_ca8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          RStack_ca8._stats._packed = 0;
          RStack_ca8._used._masks[0] = 0;
          RStack_ca8._used._masks[1] = 0;
          RStack_ca8._used._masks[2] = 0;
          RStack_ca8._used._masks[3] = 0;
          RStack_ca8._clobbered._masks[0] = 0;
          RStack_ca8._clobbered._masks[1] = 0;
          RStack_ca8._clobbered._masks[2] = 0;
          RStack_ca8._clobbered._masks[3] = 0;
          RStack_ca8._cur = pRVar20;
          EVar10 = x86::RACFGBuilder::onInst
                             (this_00,&invokeNode->super_InstNode,&uStack_cdc,&RStack_ca8);
          if (EVar10 != 0) {
            return EVar10;
          }
          uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar9 == '\x12') {
            EVar10 = x86::RACFGBuilder::onInvoke(this_00,invokeNode,&RStack_ca8);
            if (EVar10 != 0) {
              return EVar10;
            }
            uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          }
          if (uVar9 == '\x11') {
            EVar10 = x86::RACFGBuilder::onRet(this_00,(FuncRetNode *)invokeNode,&RStack_ca8);
            if (EVar10 != 0) {
              return EVar10;
            }
            uStack_cdc = 4;
          }
          else if ((uStack_cdc == 1) && (pRVar20 != RStack_ca8._cur)) {
            pBVar21 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
            uVar18 = 0;
            do {
              if ((pBVar21->_workRegs).super_ZoneVectorBase._size <= pRVar20->_workId) {
                RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                goto LAB_00133ccd;
              }
              uVar19 = uVar18;
              if ((*(byte *)(*(long *)((long)(pBVar21->_workRegs).super_ZoneVectorBase._data +
                                      (ulong)pRVar20->_workId * 8) + 0x21) & 0xf) == 0) {
                bVar15 = (pRVar20->field_5).field_0._useId;
                if (bVar15 == 0xff) {
                  uVar19 = (ulong)((int)uVar18 + 1);
                  bVar15 = pBVar21->_scratchRegIndexes[uVar18];
                  (pRVar20->field_5).field_0._useId = bVar15;
                }
                (*item)->_exitScratchGpRegs = (*item)->_exitScratchGpRegs | 1 << (bVar15 & 0x1f);
              }
              pRVar20 = pRVar20 + 1;
              uVar18 = uVar19;
            } while (pRVar20 != RStack_ca8._cur);
          }
          EVar10 = BaseRAPass::assignRAInst
                             ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                              (BaseNode *)invokeNode,
                              (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock,
                              &RStack_ca8);
          uVar4 = uStack_cdc;
          if (EVar10 != 0) {
            return EVar10;
          }
          uVar16 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed
                   | RStack_ca8._stats._packed;
          (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = uVar16;
          if (uStack_cdc == 0) goto LAB_00133b9c;
          if (2 < uStack_cdc) {
            if (uStack_cdc != 4) goto LAB_00133b9c;
            pRVar11 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock;
            pRVar11->_last = (BaseNode *)invokeNode;
            *(byte *)&pRVar11->_flags = (byte)pRVar11->_flags | 1;
            (pRVar11->_regsStats)._packed = (pRVar11->_regsStats)._packed | uVar16;
            EVar10 = RABlock::appendSuccessor
                               (pRVar11,(this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                        _retBlock);
            goto LAB_0013390f;
          }
          pRVar11 = *item;
          pRVar11->_last = (BaseNode *)invokeNode;
          uVar22 = pRVar11->_flags;
          pRVar11->_flags = uVar22 | 0x101;
          (pRVar11->_regsStats)._packed = (pRVar11->_regsStats)._packed | uVar16;
          if (((invokeNode->super_InstNode)._baseInst._options & 2) == 0) {
            bVar15 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._reserved0;
            if (bVar15 == 0) break;
            uVar16 = bVar15 - 1;
            if (((invokeNode->super_InstNode)._opArray[uVar16]._signature & 7) == 4) {
              EVar10 = BaseBuilder::labelNodeOf
                                 (&((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc)->
                                   super_BaseBuilder,&pLStack_cd0,
                                  (invokeNode->super_InstNode)._opArray[uVar16]._baseId);
              if (EVar10 != 0) {
                return EVar10;
              }
              pRVar11 = BaseRAPass::newBlockOrExistingAt
                                  ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                   pLStack_cd0,(BaseNode **)0x0);
              if (pRVar11 == (RABlock *)0x0) {
                return 1;
              }
              *(byte *)&pRVar11->_flags = (byte)pRVar11->_flags | 4;
              EVar10 = RABlock::appendSuccessor(*item,pRVar11);
            }
            else {
              pRVar11->_flags = uVar22 | 0x501;
              if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x0f') &&
                 (lVar23 = *(long *)&(invokeNode->_funcDetail)._callConv, lVar23 != 0)) {
                pBVar21 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
                uVar24 = pBVar21->_lastTimestamp + 1;
                pBVar21->_lastTimestamp = uVar24;
                uVar16 = *(uint *)(lVar23 + 0x18);
                if ((ulong)uVar16 != 0) {
                  lStack_cb8 = *(long *)(lVar23 + 0x10);
                  lVar23 = 0;
                  do {
                    EVar10 = BaseBuilder::labelNodeOf
                                       (&((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                         _cc)->super_BaseBuilder,&pLStack_cd0,
                                        *(uint32_t *)(lStack_cb8 + lVar23));
                    if (EVar10 != 0) {
                      return EVar10;
                    }
                    pRVar11 = BaseRAPass::newBlockOrExistingAt
                                        ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                         _pass,pLStack_cd0,(BaseNode **)0x0);
                    if (pRVar11 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (pRVar11->_timestamp != uVar24) {
                      pRVar11->_timestamp = uVar24;
                      *(byte *)&pRVar11->_flags = (byte)pRVar11->_flags | 4;
                      EVar10 = RABlock::appendSuccessor(*ppRStack_cd8,pRVar11);
                      if (EVar10 != 0) {
                        return EVar10;
                      }
                    }
                    lVar23 = lVar23 + 4;
                  } while ((ulong)uVar16 << 2 != lVar23);
                  pRVar11 = *ppRStack_cd8;
                  item = ppRStack_cd8;
                }
                EVar10 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
                                   (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,pRVar11
                                   );
              }
              else {
                EVar10 = ZoneVector<asmjit::RABlock_*>::append
                                   (&ZStack_cc8,
                                    &((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                     _pass)->_allocator,item);
              }
            }
            if (EVar10 != 0) {
              return EVar10;
            }
          }
          if (uVar4 != 1) {
            if (initialNode == (InvokeNode *)0x0) break;
            if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode + 1))->
                _any)._nodeType == '\x03') {
              pRVar11 = *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0;
              if (pRVar11 == (RABlock *)0x0) {
                pRVar11 = BaseRAPass::newBlock
                                    ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass
                                     ,(BaseNode *)initialNode);
                if (pRVar11 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)
                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)[2].
                  field_0 = pRVar11;
              }
            }
            else {
              pRVar11 = BaseRAPass::newBlock
                                  ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                   (BaseNode *)initialNode);
              if (pRVar11 == (RABlock *)0x0) {
                return 1;
              }
            }
            pRVar12 = *item;
            puVar2 = &pRVar12->_flags;
            *puVar2 = *puVar2 | 0x200;
            EVar10 = RABlock::prependSuccessor(pRVar12,pRVar11);
            if (EVar10 != 0) {
              return EVar10;
            }
            (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock = pRVar11;
            (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._hasCode = false;
            (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._blockRegStats._packed = 0;
            if ((pRVar11->_flags & 1) != 0) {
LAB_00133c6f:
              pvVar8 = ZStack_cc8.super_ZoneVectorBase._data;
              pBVar21 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
              if (pBVar21->_createdBlockCount == (pBVar21->_blocks).super_ZoneVectorBase._size) {
                uVar18 = ZStack_cc8.super_ZoneVectorBase._8_8_ & 0xffffffff;
                if (uVar18 != 0) {
                  lVar23 = 0;
                  do {
                    RACFGBuilderT<asmjit::x86::RACFGBuilder>::handleBlockWithUnknownJump
                              (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                               *(RABlock **)((long)pvVar8 + lVar23));
                    lVar23 = lVar23 + 8;
                  } while (uVar18 << 3 != lVar23);
                  pBVar21 = (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
                }
                EVar10 = BaseRAPass::initSharedAssignments
                                   (pBVar21,&(this_00->
                                             super_RACFGBuilderT<asmjit::x86::RACFGBuilder>).
                                             _sharedAssignmentsMap);
                return EVar10;
              }
              return 3;
            }
            EVar10 = BaseRAPass::addBlock
                               ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                pRVar11);
            if (EVar10 != 0) {
              return EVar10;
            }
            invokeNode = initialNode;
            if ((this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._logger != (Logger *)0x0)
            {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        (&this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>,
                         (this_00->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock,2);
            }
            goto LAB_00133567;
          }
LAB_00133b95:
          *item = (RABlock *)0x0;
        }
LAB_00133b9c:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_00133ccd:
    EVar10 = 3;
  }
  return EVar10;
}

Assistant:

ASMJIT_INLINE uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }